

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

ResourceTable * __thiscall
icu_63::ResourceDataValue::getTable
          (ResourceTable *__return_storage_ptr__,ResourceDataValue *this,UErrorCode *errorCode)

{
  ushort *puVar1;
  uint *puVar2;
  ushort uVar3;
  int32_t *piVar4;
  uint uVar5;
  uint *puVar7;
  ushort *puVar8;
  uint uVar9;
  uint16_t *puVar10;
  uint32_t *puVar11;
  ulong uVar6;
  
  if (U_ZERO_ERROR < *errorCode) {
LAB_001c8b76:
    __return_storage_ptr__->items16 = (uint16_t *)0x0;
    __return_storage_ptr__->items32 = (uint32_t *)0x0;
    __return_storage_ptr__->keys16 = (uint16_t *)0x0;
    __return_storage_ptr__->keys32 = (int32_t *)0x0;
    __return_storage_ptr__->length = 0;
    return __return_storage_ptr__;
  }
  uVar5 = this->res & 0xfffffff;
  uVar6 = (ulong)uVar5;
  uVar9 = this->res >> 0x1c;
  if (uVar9 == 5) {
    puVar10 = this->pResData->p16BitUnits;
    puVar1 = puVar10 + uVar6;
    puVar8 = puVar1 + 1;
    uVar3 = *puVar1;
    uVar5 = (uint)uVar3;
    puVar10 = puVar10 + uVar6 + (ulong)uVar3 + 1;
    puVar7 = (uint *)0x0;
    puVar11 = (uint32_t *)0x0;
  }
  else {
    if (uVar9 == 4) {
      if (uVar5 != 0) {
        piVar4 = this->pResData->pRoot;
        puVar2 = (uint *)(piVar4 + uVar6);
        puVar7 = puVar2 + 1;
        uVar5 = *puVar2;
        puVar11 = (uint32_t *)(piVar4 + uVar6 + (long)(int)uVar5 + 1);
        puVar10 = (uint16_t *)0x0;
        puVar8 = (ushort *)0x0;
        goto LAB_001c8c4d;
      }
    }
    else {
      if (uVar9 != 2) {
        *errorCode = U_RESOURCE_TYPE_MISMATCH;
        goto LAB_001c8b76;
      }
      if (uVar5 != 0) {
        piVar4 = this->pResData->pRoot;
        puVar1 = (ushort *)(piVar4 + uVar6);
        puVar8 = puVar1 + 1;
        uVar3 = *puVar1;
        uVar5 = (uint)uVar3;
        puVar11 = (uint32_t *)
                  ((long)piVar4 + (ulong)(~(uint)uVar3 & 1) * 2 + (ulong)uVar3 * 2 + uVar6 * 4 + 2);
        puVar7 = (uint *)0x0;
        puVar10 = (uint16_t *)0x0;
        goto LAB_001c8c4d;
      }
    }
    puVar7 = (uint *)0x0;
    puVar10 = (uint16_t *)0x0;
    puVar11 = (uint32_t *)0x0;
    puVar8 = (ushort *)0x0;
    uVar5 = 0;
  }
LAB_001c8c4d:
  __return_storage_ptr__->keys16 = puVar8;
  __return_storage_ptr__->keys32 = (int32_t *)puVar7;
  __return_storage_ptr__->items16 = puVar10;
  __return_storage_ptr__->items32 = puVar11;
  __return_storage_ptr__->length = uVar5;
  return __return_storage_ptr__;
}

Assistant:

ResourceTable ResourceDataValue::getTable(UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return ResourceTable();
    }
    const uint16_t *keys16 = NULL;
    const int32_t *keys32 = NULL;
    const uint16_t *items16 = NULL;
    const Resource *items32 = NULL;
    uint32_t offset = RES_GET_OFFSET(res);
    int32_t length = 0;
    switch(RES_GET_TYPE(res)) {
    case URES_TABLE:
        if (offset != 0) {  // empty if offset==0
            keys16 = (const uint16_t *)(pResData->pRoot+offset);
            length = *keys16++;
            items32 = (const Resource *)(keys16+length+(~length&1));
        }
        break;
    case URES_TABLE16:
        keys16 = pResData->p16BitUnits+offset;
        length = *keys16++;
        items16 = keys16 + length;
        break;
    case URES_TABLE32:
        if (offset != 0) {  // empty if offset==0
            keys32 = pResData->pRoot+offset;
            length = *keys32++;
            items32 = (const Resource *)keys32 + length;
        }
        break;
    default:
        errorCode = U_RESOURCE_TYPE_MISMATCH;
        return ResourceTable();
    }
    return ResourceTable(keys16, keys32, items16, items32, length);
}